

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  string top_dir;
  char *git_submodule [5];
  OutputLogger submodule_out;
  OutputLogger submodule_err;
  string local_e8;
  pointer local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  LineParser local_98;
  LineParser local_58;
  
  bVar2 = UpdateInternal(this);
  if (bVar2) {
    FindTopDir_abi_cxx11_(&local_e8,this);
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    uVar3 = GetGitVersion(this);
    if (uVar3 < 0xa1d1c8) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     &local_e8,"/.gitmodules");
      bVar2 = cmsys::SystemTools::FileExists((char *)local_98.super_OutputParser._vptr_OutputParser)
      ;
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar2) {
        std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                        "Git < 1.6.5.0 cannot update submodules recursively\n");
      }
      local_b0 = (char *)0x0;
    }
    else {
      local_b0 = "--recursive";
    }
    local_c0 = "submodule";
    local_b8 = "update";
    local_a8 = 0;
    local_c8 = pcVar1;
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)&local_98,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "submodule-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)&local_58,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "submodule-err> ");
    bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,&local_c8,&local_98.super_OutputParser,
                                &local_58.super_OutputParser,local_e8._M_dataplus._M_p);
    cmProcessTools::LineParser::~LineParser(&local_58);
    cmProcessTools::LineParser::~LineParser(&local_98);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if(!this->UpdateInternal())
    {
    return false;
    }

  std::string top_dir = this->FindTopDir();
  const char* git = this->CommandLineTool.c_str();
  const char* recursive = "--recursive";

  // Git < 1.6.5.0 did not support --recursive
  if(this->GetGitVersion() < cmCTestGITVersion(1,6,5,0))
    {
    recursive = 0;
    // No need to require >= 1.6.5.0 if there are no submodules.
    if(cmSystemTools::FileExists((top_dir + "/.gitmodules").c_str()))
      {
      this->Log << "Git < 1.6.5.0 cannot update submodules recursively\n";
      }
    }

  char const* git_submodule[] = {git, "submodule", "update", recursive, 0};
  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir.c_str());
}